

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwshandshake.hpp
# Opt level: O1

void __thiscall
WebSocketHandshakeKeyGen::static_for<10,_WebSocketHandshakeKeyGen::Sha1Loop<5>_>::operator()
          (static_for<10,_WebSocketHandshakeKeyGen::Sha1Loop<5>_> *this,uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  static_for<9,_WebSocketHandshakeKeyGen::Sha1Loop<5>_> local_11;
  
  static_for<9,_WebSocketHandshakeKeyGen::Sha1Loop<5>_>::operator()(&local_11,a,b);
  uVar1 = b[0xd] ^ b[2] ^ b[7] ^ b[5];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[5] = uVar2;
  uVar1 = a[2];
  a[4] = a[4] + (a[3] << 5 | a[3] >> 0x1b) + (a[1] ^ *a ^ uVar1) + uVar2 + 0xca62c1d6;
  a[2] = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

void operator()(uint32_t *a, uint32_t *b) {
            static_for<N - 1, T>()(a, b);
            T::template f<N - 1>(a, b);
        }